

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTimeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DateTimeValidator::setEnumeration(DateTimeValidator *this,MemoryManager *param_1)

{
  RefArrayVectorOf<char16_t> *pRVar1;
  XMLSize_t maxElems;
  BaseRefVectorOf<xercesc_4_0::XMLNumber> *this_00;
  int iVar2;
  RefVectorOf<xercesc_4_0::XMLNumber> *this_01;
  char16_t *pcVar3;
  undefined4 extraout_var;
  XMLSize_t i;
  XMLSize_t getAt;
  
  pRVar1 = (this->super_AbstractNumericFacetValidator).fStrEnumeration;
  if (pRVar1 != (RefArrayVectorOf<char16_t> *)0x0) {
    maxElems = (pRVar1->super_BaseRefVectorOf<char16_t>).fCurCount;
    this_01 = (RefVectorOf<xercesc_4_0::XMLNumber> *)
              XMemory::operator_new
                        (0x30,(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                              fMemoryManager);
    RefVectorOf<xercesc_4_0::XMLNumber>::RefVectorOf
              (this_01,maxElems,true,
               (this->super_AbstractNumericFacetValidator).super_DatatypeValidator.fMemoryManager);
    (this->super_AbstractNumericFacetValidator).fEnumeration = this_01;
    (this->super_AbstractNumericFacetValidator).fEnumerationInherited = false;
    for (getAt = 0; maxElems != getAt; getAt = getAt + 1) {
      this_00 = &((this->super_AbstractNumericFacetValidator).fEnumeration)->
                 super_BaseRefVectorOf<xercesc_4_0::XMLNumber>;
      pcVar3 = BaseRefVectorOf<char16_t>::elementAt
                         (&((this->super_AbstractNumericFacetValidator).fStrEnumeration)->
                           super_BaseRefVectorOf<char16_t>,getAt);
      iVar2 = (*(this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                super_XSerializable._vptr_XSerializable[0x17])
                        (this,pcVar3,
                         (this->super_AbstractNumericFacetValidator).super_DatatypeValidator.
                         fMemoryManager);
      BaseRefVectorOf<xercesc_4_0::XMLNumber>::insertElementAt
                (this_00,(XMLNumber *)CONCAT44(extraout_var,iVar2),getAt);
    }
  }
  return;
}

Assistant:

void DateTimeValidator::setEnumeration(MemoryManager* const)
{
// to do: do we need to check against base value space???

    if (!fStrEnumeration)
        return;

    XMLSize_t enumLength = fStrEnumeration->size();
    fEnumeration = new (fMemoryManager) RefVectorOf<XMLNumber>(enumLength, true, fMemoryManager);
    fEnumerationInherited = false;

    for ( XMLSize_t i = 0; i < enumLength; i++)
        fEnumeration->insertElementAt(parse(fStrEnumeration->elementAt(i), fMemoryManager), i);

}